

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

void vocdusave_delobj(voccxdef *ctx,objnum objn)

{
  long lVar1;
  uint uVar2;
  uint i;
  uchar *__src;
  uchar *puVar3;
  mcmcxdef *ctx_00;
  ushort in_SI;
  long in_RDI;
  delobj_cb_ctx fnctx;
  _func_void_void_ptr_vocdef_ptr_vocwdef_ptr *in_stack_00000010;
  int wrdcnt;
  int wrdsiz;
  uint siz;
  uchar *objp;
  uchar *p;
  objucxdef *uc;
  ushort in_stack_ffffffffffffffbc;
  mcmon in_stack_ffffffffffffffbe;
  objucxdef *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  short sVar4;
  int in_stack_ffffffffffffffd0;
  short sVar5;
  voccxdef *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_RDI + 0x20);
  __src = mcmlck((mcmcxdef *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (mcmon)((ulong)in_stack_ffffffffffffffc0 >> 0x30));
  uVar2 = osrp2(__src + 8);
  i = uVar2 & 0xffff;
  voc_count(in_stack_ffffffffffffffe0,(objnum)((ulong)__src >> 0x30),(prpnum)((ulong)__src >> 0x20),
            (int *)(CONCAT44(uVar2,in_stack_ffffffffffffffd0) & 0xffffffffffff),
            (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  uVar2 = in_stack_ffffffffffffffcc * 6 + in_stack_ffffffffffffffd0;
  puVar3 = objures(in_stack_ffffffffffffffc0,(uchar)(in_stack_ffffffffffffffbe >> 8),
                   in_stack_ffffffffffffffbc);
  *puVar3 = '\x03';
  oswp2(puVar3 + 1,(uint)in_SI);
  oswp2(puVar3 + 3,i);
  oswp2(puVar3 + 5,uVar2);
  sVar4 = (short)uVar2;
  memcpy(puVar3 + 7,__src,(ulong)i);
  ctx_00 = (mcmcxdef *)(puVar3 + (ulong)i + 7);
  voc_iterate((voccxdef *)objp,siz._2_2_,in_stack_00000010,fnctx.p);
  sVar5 = (short)i;
  mcmunlck(ctx_00,in_stack_ffffffffffffffbe);
  *(short *)(lVar1 + 0x12) = *(short *)(lVar1 + 0x12) + sVar5 + 7 + sVar4;
  return;
}

Assistant:

void vocdusave_delobj(voccxdef *ctx, objnum objn)
{
    objucxdef *uc = ctx->voccxundo;
    uchar     *p;
    uchar     *objp;
    uint       siz;
    int        wrdsiz;
    int        wrdcnt;
    struct delobj_cb_ctx fnctx;

    /* figure out how much we need to save */
    objp = mcmlck(ctx->voccxmem, (mcmon)objn);
    siz = objfree(objp);

    /* figure the word size */
    voc_count(ctx, objn, 0, &wrdcnt, &wrdsiz);

    /*
     *   we need to store an additional 6 bytes (2-length1, 2-length2,
     *   1-type, 1-flags) for each word 
     */
    wrdsiz += wrdcnt*6;

    /* set up the undo header */
    p = objures(uc, OBJUCLI, (ushort)(7 + siz + wrdsiz));
    *p = VOC_UNDO_DELOBJ;
    oswp2(p+1, objn);
    oswp2(p+3, siz);
    oswp2(p+5, wrdsiz);

    /* save the object's data */
    memcpy(p+7, objp, (size_t)siz);

    /* write the words */
    fnctx.p = p+7 + siz;
    voc_iterate(ctx, objn, delobj_cb, &fnctx);

    /* unlock the object and advance the undo pointer */
    mcmunlck(ctx->voccxmem, (mcmon)objn);
    uc->objucxhead += 7 + siz + wrdsiz;
}